

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

ostream * lambda::operator<<(ostream *os,Parse_ast *ast)

{
  long lVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  undefined8 *puVar3;
  Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:17:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  local_18;
  
  lVar1 = (long)(char)(ast->underlying_).
                      super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      .
                      super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      .
                      super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      .
                      super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      .
                      super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      .
                      super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      ._M_index;
  local_18.super_anon_class_8_1_3fcf66a2.os = os;
  local_18.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .super_anon_class_8_1_3fcf66a2.os = os;
  local_18.
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:18:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .
  super_Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_parse_ast_cpp:21:7)>
  .super_anon_class_8_1_3fcf66a2.os = (anon_class_8_1_3fcf66a2)(anon_class_8_1_3fcf66a2)os;
  if (lVar1 != -1) {
    pbVar2 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::basic_ostream<char,_std::char_traits<char>_>_&>,_ublib::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:17:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:18:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/parse_ast.cpp:21:7)>_&&,_const_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&>
               ::_S_vtable._M_arr[lVar1]._M_data)(&local_18,&ast->underlying_);
    return pbVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_00109b30;
  puVar3[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

std::ostream& operator<<(std::ostream& os, Parse_ast const& ast) noexcept {
  return match(ast)(
      [&](Parse_ast::Variable const& v) -> std::ostream& { return os << v.name(); },
      [&](Parse_ast::Call const& v) -> std::ostream& {
        return os << v.callee() << ' ' << v.argument();
      },
      [&](Parse_ast::Lambda const& v) -> std::ostream& {
        return os << '(' << '/' << v.parameter() << '.' << v.expression()
                  << ')';
      });
}